

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r4.h
# Opt level: O1

void sort_5_4::bubble_sort_1(int *a,int n)

{
  return;
}

Assistant:

void bubble_sort_1(int *a, int n) {
        int f = 1;
        for (int i = 0; i < n && f == 1; i++) {
            f = 0;
            for (int j = i; j < n; j++) {
                if (a[j] < a[i]) {
                    swap_(&a[j], &a[i]);
                    f = 1;
                }
            }
        }
    }